

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O1

fct_logger_i * fckern_sel_log(fct_logger_types_t *search,char *sel_logger)

{
  int iVar1;
  fct_logger_types_t *pfVar2;
  fct_logger_i *pfVar3;
  char *s1;
  
  if (*sel_logger == '\0') {
    __assert_fail("strlen(sel_logger) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x81d
                  ,"fct_logger_i *fckern_sel_log(fct_logger_types_t *, const char *)");
  }
  s1 = search->name;
  if (s1 != (char *)0x0) {
    pfVar2 = search + 1;
    do {
      iVar1 = fctstr_ieq(s1,sel_logger);
      if (iVar1 != 0) {
        pfVar3 = (*pfVar2[-1].logger_new_fn)();
        return pfVar3;
      }
      s1 = pfVar2->name;
      pfVar2 = pfVar2 + 1;
    } while (s1 != (char *)0x0);
  }
  return (fct_logger_i *)0x0;
}

Assistant:

static fct_logger_i*
fckern_sel_log(fct_logger_types_t *search, char const *sel_logger)
{
    fct_logger_types_t *iter;
    FCT_ASSERT(search != NULL);
    FCT_ASSERT(sel_logger != NULL);
    FCT_ASSERT(strlen(sel_logger) > 0);
    for ( iter = search; iter->name != NULL; ++iter)
    {
        if ( fctstr_ieq(iter->name, sel_logger) )
        {
            return iter->logger_new_fn();
        }
    }
    return NULL;
}